

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationObject.h
# Opt level: O0

void __thiscall
Js::ActivationObjectEx::ActivationObjectEx
          (ActivationObjectEx *this,DynamicType *type,ScriptFunction *func,uint cachedFuncCount,
          uint firstFuncSlot,uint lastFuncSlot)

{
  FuncCacheEntry *local_40;
  nullptr_t local_38;
  Type local_2c;
  Type local_28;
  uint lastFuncSlot_local;
  uint firstFuncSlot_local;
  uint cachedFuncCount_local;
  ScriptFunction *func_local;
  DynamicType *type_local;
  ActivationObjectEx *this_local;
  
  local_2c = lastFuncSlot;
  local_28 = firstFuncSlot;
  lastFuncSlot_local = cachedFuncCount;
  _firstFuncSlot_local = func;
  func_local = (ScriptFunction *)type;
  type_local = (DynamicType *)this;
  ActivationObject::ActivationObject(&this->super_ActivationObject,type);
  (this->super_ActivationObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01e45ac8;
  Memory::WriteBarrierPtr<Js::ScriptFunction>::WriteBarrierPtr
            (&this->parentFunc,_firstFuncSlot_local);
  this->cachedFuncCount = lastFuncSlot_local;
  this->firstFuncSlot = local_28;
  this->lastFuncSlot = local_2c;
  this->committed = false;
  local_40 = this->cache;
  do {
    FuncCacheEntry::FuncCacheEntry(local_40);
    local_40 = local_40 + 1;
  } while ((ActivationObjectEx *)local_40 != this + 1);
  if (lastFuncSlot_local != 0) {
    local_38 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Js::ScriptFunction>::operator=(&this->cache[0].func,&local_38);
  }
  return;
}

Assistant:

ActivationObjectEx(
            DynamicType * type, ScriptFunction *func, uint cachedFuncCount, uint firstFuncSlot, uint lastFuncSlot)
            : ActivationObject(type),
              parentFunc(func),
              cachedFuncCount(cachedFuncCount),
              firstFuncSlot(firstFuncSlot),
              lastFuncSlot(lastFuncSlot),
              committed(false)
        {
            if (cachedFuncCount != 0)
            {
                cache[0].func = nullptr;
            }
        }